

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O0

void __thiscall duckdb::FixedDecimalStatistics::Update(FixedDecimalStatistics *this,hugeint_t *val)

{
  bool bVar1;
  hugeint_t *in_RSI;
  hugeint_t *in_RDI;
  
  bVar1 = LessThan::Operation<duckdb::hugeint_t>(in_RSI,in_RDI);
  if (bVar1) {
    in_RDI->upper = in_RSI->lower;
    in_RDI[1].lower = in_RSI->upper;
  }
  bVar1 = GreaterThan::Operation<duckdb::hugeint_t>((hugeint_t *)this,val);
  if (bVar1) {
    in_RDI[1].upper = in_RSI->lower;
    in_RDI[2].lower = in_RSI->upper;
  }
  return;
}

Assistant:

void Update(hugeint_t &val) {
		if (LessThan::Operation(val, min)) {
			min = val;
		}
		if (GreaterThan::Operation(val, max)) {
			max = val;
		}
	}